

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O0

int __thiscall crnlib::dynamic_string::find_right(dynamic_string *this,char *p,bool case_sensitive)

{
  int iVar1;
  size_t sVar2;
  code *local_40;
  int local_2c;
  int i;
  int p_len;
  bool case_sensitive_local;
  char *p_local;
  dynamic_string *this_local;
  
  sVar2 = strlen(p);
  local_2c = (uint)this->m_len - (int)sVar2;
  while( true ) {
    if (local_2c < 0) {
      return -1;
    }
    if (case_sensitive) {
      local_40 = strncmp;
    }
    else {
      local_40 = strncasecmp;
    }
    iVar1 = (*local_40)(p,this->m_pStr + local_2c,(long)(int)sVar2);
    if (iVar1 == 0) break;
    local_2c = local_2c + -1;
  }
  return local_2c;
}

Assistant:

int dynamic_string::find_right(const char* p, bool case_sensitive) const
    {
        CRNLIB_ASSERT(p);
        const int p_len = (int)strlen(p);

        for (int i = m_len - p_len; i >= 0; i--)
        {
            if ((case_sensitive ? strncmp : _strnicmp)(p, &m_pStr[i], p_len) == 0)
            {
                return i;
            }
        }

        return -1;
    }